

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pjpeg-idct.c
# Opt level: O2

void pjpeg_idct_2D_double(int32_t *in,uint8_t *out,uint32_t outstride)

{
  int i;
  long lVar1;
  double *pdVar2;
  int iVar3;
  long lVar4;
  double dVar5;
  double dVar6;
  double tmp [64];
  double dout [64];
  double din [64];
  
  for (lVar1 = 0; lVar1 != 0x40; lVar1 = lVar1 + 1) {
    din[lVar1] = (double)in[lVar1];
  }
  for (lVar1 = 0; lVar1 != 0x200; lVar1 = lVar1 + 0x40) {
    idct_1D_double((double *)((long)din + lVar1),1,(double *)((long)tmp + lVar1),1);
  }
  for (lVar1 = 0; lVar1 != 0x40; lVar1 = lVar1 + 8) {
    idct_1D_double((double *)((long)tmp + lVar1),8,(double *)((long)dout + lVar1),8);
  }
  pdVar2 = dout;
  iVar3 = 0;
  for (lVar1 = 0; lVar1 != 8; lVar1 = lVar1 + 1) {
    for (lVar4 = 0; lVar4 != 8; lVar4 = lVar4 + 1) {
      dVar5 = pdVar2[lVar4] * 0.25 + 128.0;
      dVar6 = 0.0;
      if (0.0 <= dVar5) {
        dVar6 = dVar5;
      }
      dVar5 = 255.0;
      if (dVar6 <= 255.0) {
        dVar5 = dVar6;
      }
      pdVar2[lVar4] = dVar5;
      out[(uint)(iVar3 + (int)lVar4)] = (uint8_t)(int)dVar5;
    }
    pdVar2 = pdVar2 + 8;
    iVar3 = iVar3 + outstride;
  }
  return;
}

Assistant:

void pjpeg_idct_2D_double(int32_t in[64], uint8_t *out, uint32_t outstride)
{
    double din[64], dout[64];
    for (int i = 0; i < 64; i++)
        din[i] = in[i];

    double tmp[64];

    // idct on rows
    for (int y = 0; y < 8; y++)
        idct_1D_double(&din[8*y], 1, &tmp[8*y], 1);

    // idct on columns
    for (int x = 0; x < 8; x++)
        idct_1D_double(&tmp[x], 8, &dout[x], 8);

    // scale, adjust bias, and clamp
    for (int y = 0; y < 8; y++) {
        for (int x = 0; x < 8; x++) {
            int i = 8*y + x;

            dout[i] = (dout[i] / 4) + 128;
            if (dout[i] < 0)
                dout[i] = 0;
            if (dout[i] > 255)
                dout[i] = 255;

            // XXX round by adding +.5?
            out[y*outstride + x] = dout[i];
        }
    }
}